

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenization_args.h
# Opt level: O3

Options * build_tokenization_options(Options *__return_storage_ptr__,ParseResult *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer __pos;
  Mode MVar2;
  OptionValue *pOVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  bool *pbVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  string local_38;
  
  __return_storage_ptr__->mode = Conservative;
  (__return_storage_ptr__->lang)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->lang).field_2
  ;
  (__return_storage_ptr__->lang)._M_string_length = 0;
  (__return_storage_ptr__->lang).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->no_substitution = false;
  __return_storage_ptr__->case_feature = false;
  __return_storage_ptr__->case_markup = false;
  __return_storage_ptr__->soft_case_regions = false;
  __return_storage_ptr__->with_separators = false;
  __return_storage_ptr__->allow_isolated_marks = false;
  __return_storage_ptr__->joiner_annotate = false;
  __return_storage_ptr__->joiner_new = false;
  (__return_storage_ptr__->joiner)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->joiner).field_2;
  (__return_storage_ptr__->joiner)._M_string_length = 0;
  (__return_storage_ptr__->joiner).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->spacer_annotate = false;
  __return_storage_ptr__->spacer_new = false;
  __return_storage_ptr__->preserve_placeholders = false;
  __return_storage_ptr__->preserve_segmented_tokens = false;
  __return_storage_ptr__->support_prior_joiners = false;
  __return_storage_ptr__->segment_case = false;
  __return_storage_ptr__->segment_numbers = false;
  __return_storage_ptr__->segment_alphabet_change = false;
  (__return_storage_ptr__->segment_alphabet).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->segment_alphabet).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->segment_alphabet).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->segment_alphabet_codes)._M_h._M_buckets =
       &(__return_storage_ptr__->segment_alphabet_codes)._M_h._M_single_bucket;
  (__return_storage_ptr__->segment_alphabet_codes)._M_h._M_bucket_count = 1;
  (__return_storage_ptr__->segment_alphabet_codes)._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)0x0;
  (__return_storage_ptr__->segment_alphabet_codes)._M_h._M_element_count = 0;
  (__return_storage_ptr__->segment_alphabet_codes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->segment_alphabet_codes)._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->segment_alphabet_codes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  paVar1 = &local_38.field_2;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"mode","");
  pOVar3 = cxxopts::ParseResult::operator[](args,&local_38);
  pbVar4 = cxxopts::OptionValue::as<std::__cxx11::string>(pOVar3);
  MVar2 = onmt::Tokenizer::str_to_mode((string *)pbVar4);
  __return_storage_ptr__->mode = MVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"lang","");
  pOVar3 = cxxopts::ParseResult::operator[](args,&local_38);
  cxxopts::OptionValue::as<std::__cxx11::string>(pOVar3);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->lang);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"no_substitution","");
  pOVar3 = cxxopts::ParseResult::operator[](args,&local_38);
  pbVar5 = cxxopts::OptionValue::as<bool>(pOVar3);
  __return_storage_ptr__->no_substitution = *pbVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"with_separators","");
  pOVar3 = cxxopts::ParseResult::operator[](args,&local_38);
  pbVar5 = cxxopts::OptionValue::as<bool>(pOVar3);
  __return_storage_ptr__->with_separators = *pbVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"allow_isolated_marks","");
  pOVar3 = cxxopts::ParseResult::operator[](args,&local_38);
  pbVar5 = cxxopts::OptionValue::as<bool>(pOVar3);
  __return_storage_ptr__->allow_isolated_marks = *pbVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"case_feature","");
  pOVar3 = cxxopts::ParseResult::operator[](args,&local_38);
  pbVar5 = cxxopts::OptionValue::as<bool>(pOVar3);
  __return_storage_ptr__->case_feature = *pbVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"case_markup","");
  pOVar3 = cxxopts::ParseResult::operator[](args,&local_38);
  pbVar5 = cxxopts::OptionValue::as<bool>(pOVar3);
  __return_storage_ptr__->case_markup = *pbVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"soft_case_regions","");
  pOVar3 = cxxopts::ParseResult::operator[](args,&local_38);
  pbVar5 = cxxopts::OptionValue::as<bool>(pOVar3);
  __return_storage_ptr__->soft_case_regions = *pbVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"joiner_annotate","");
  pOVar3 = cxxopts::ParseResult::operator[](args,&local_38);
  pbVar5 = cxxopts::OptionValue::as<bool>(pOVar3);
  __return_storage_ptr__->joiner_annotate = *pbVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"joiner_new","");
  pOVar3 = cxxopts::ParseResult::operator[](args,&local_38);
  pbVar5 = cxxopts::OptionValue::as<bool>(pOVar3);
  __return_storage_ptr__->joiner_new = *pbVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"joiner","");
  pOVar3 = cxxopts::ParseResult::operator[](args,&local_38);
  cxxopts::OptionValue::as<std::__cxx11::string>(pOVar3);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->joiner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"spacer_annotate","");
  pOVar3 = cxxopts::ParseResult::operator[](args,&local_38);
  pbVar5 = cxxopts::OptionValue::as<bool>(pOVar3);
  __return_storage_ptr__->spacer_annotate = *pbVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"spacer_new","");
  pOVar3 = cxxopts::ParseResult::operator[](args,&local_38);
  pbVar5 = cxxopts::OptionValue::as<bool>(pOVar3);
  __return_storage_ptr__->spacer_new = *pbVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"preserve_placeholders","");
  pOVar3 = cxxopts::ParseResult::operator[](args,&local_38);
  pbVar5 = cxxopts::OptionValue::as<bool>(pOVar3);
  __return_storage_ptr__->preserve_placeholders = *pbVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"preserve_segmented_tokens","");
  pOVar3 = cxxopts::ParseResult::operator[](args,&local_38);
  pbVar5 = cxxopts::OptionValue::as<bool>(pOVar3);
  __return_storage_ptr__->preserve_segmented_tokens = *pbVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"support_prior_joiners","");
  pOVar3 = cxxopts::ParseResult::operator[](args,&local_38);
  pbVar5 = cxxopts::OptionValue::as<bool>(pOVar3);
  __return_storage_ptr__->support_prior_joiners = *pbVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"segment_case","");
  pOVar3 = cxxopts::ParseResult::operator[](args,&local_38);
  pbVar5 = cxxopts::OptionValue::as<bool>(pOVar3);
  __return_storage_ptr__->segment_case = *pbVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"segment_numbers","");
  pOVar3 = cxxopts::ParseResult::operator[](args,&local_38);
  pbVar5 = cxxopts::OptionValue::as<bool>(pOVar3);
  __return_storage_ptr__->segment_numbers = *pbVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"segment_alphabet_change","");
  pOVar3 = cxxopts::ParseResult::operator[](args,&local_38);
  pbVar5 = cxxopts::OptionValue::as<bool>(pOVar3);
  __return_storage_ptr__->segment_alphabet_change = *pbVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"segment_alphabet","");
  pOVar3 = cxxopts::ParseResult::operator[](args,&local_38);
  __x = cxxopts::OptionValue::
        as<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>(pOVar3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&__return_storage_ptr__->segment_alphabet,__x);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  __pos = (__return_storage_ptr__->segment_alphabet).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  if (((long)(__return_storage_ptr__->segment_alphabet).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish - (long)__pos == 0x20) &&
     (__pos->_M_string_length == 0)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_at_end(&__return_storage_ptr__->segment_alphabet,__pos);
  }
  return __return_storage_ptr__;
}

Assistant:

inline onmt::Tokenizer::Options build_tokenization_options(const cxxopts::ParseResult& args)
{
  onmt::Tokenizer::Options options;
  options.mode = onmt::Tokenizer::str_to_mode(args["mode"].as<std::string>());
  options.lang = args["lang"].as<std::string>();
  options.no_substitution = args["no_substitution"].as<bool>();
  options.with_separators = args["with_separators"].as<bool>();
  options.allow_isolated_marks = args["allow_isolated_marks"].as<bool>();
  options.case_feature = args["case_feature"].as<bool>();
  options.case_markup = args["case_markup"].as<bool>();
  options.soft_case_regions = args["soft_case_regions"].as<bool>();
  options.joiner_annotate = args["joiner_annotate"].as<bool>();
  options.joiner_new = args["joiner_new"].as<bool>();
  options.joiner = args["joiner"].as<std::string>();
  options.spacer_annotate = args["spacer_annotate"].as<bool>();
  options.spacer_new = args["spacer_new"].as<bool>();
  options.preserve_placeholders = args["preserve_placeholders"].as<bool>();
  options.preserve_segmented_tokens = args["preserve_segmented_tokens"].as<bool>();
  options.support_prior_joiners = args["support_prior_joiners"].as<bool>();
  options.segment_case = args["segment_case"].as<bool>();
  options.segment_numbers = args["segment_numbers"].as<bool>();
  options.segment_alphabet_change = args["segment_alphabet_change"].as<bool>();
  options.segment_alphabet = args["segment_alphabet"].as<std::vector<std::string>>();
  if (options.segment_alphabet.size() == 1 && options.segment_alphabet[0].empty())
    options.segment_alphabet.clear();
  return options;
}